

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMove7<(moira::Instr)71,(moira::Mode)9,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  u32 addr;
  undefined8 in_RAX;
  bool error;
  bool error_1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  uVar1 = computeEA<(moira::Mode)9,(moira::Size)4,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)4,128ul>(this,uVar1,(bool *)((long)&uStack_28 + 6));
  if (uStack_28._6_1_ == '\0') {
    (this->reg).sr.n = SUB41(uVar1 >> 0x1f,0);
    (this->reg).sr.z = uVar1 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    addr = computeEA<(moira::Mode)7,(moira::Size)4,0ul>(this,opcode >> 9 & 7);
    writeM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,addr,uVar1,(bool *)((long)&uStack_28 + 7));
    if (uStack_28._7_1_ == '\0') {
      uVar1 = (this->reg).pc;
      (this->reg).pc0 = uVar1;
      (this->queue).ird = (this->queue).irc;
      uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
      (this->queue).irc = (u16)uVar1;
    }
  }
  return;
}

Assistant:

void
Moira::execMove7(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
    
    if (!writeOp <MODE_AW,S> (dst, data)) return;
    
    prefetch<POLLIPL>();
}